

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::compress_pass(crn_comp *this,crn_comp_params *params,float *pEffective_bitrate)

{
  uint uVar1;
  uint uVar2;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  uint l;
  uint f;
  uint total_pixels;
  bool status;
  crn_comp *in_stack_00000108;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  bool local_1;
  
  clear((crn_comp *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_RDX != (float *)0x0) {
    *in_RDX = 0.0;
  }
  *(long *)(in_RDI + 0x2c8) = in_RSI;
  uVar4 = true;
  if ((((*(long *)(in_RSI + 0x18) != 10) && (uVar4 = true, *(long *)(in_RSI + 0x18) != 0xb)) &&
      (uVar4 = true, *(long *)(in_RSI + 0x18) != 0xc)) &&
     (uVar4 = true, *(long *)(in_RSI + 0x18) != 0xd)) {
    uVar4 = *(long *)(in_RSI + 0x18) == 0xe;
  }
  *(undefined1 *)(in_RDI + 0x14d3) = uVar4;
  uVar3 = true;
  if ((*(long *)(in_RSI + 0x18) != 10) && (uVar3 = true, *(long *)(in_RSI + 0x18) != 0xb)) {
    uVar3 = *(long *)(in_RSI + 0x18) == 0xc;
  }
  *(undefined1 *)(in_RDI + 0x14d4) = uVar3;
  uVar1 = math::minimum<unsigned_int>
                    (*(uint *)(*(long *)(in_RDI + 0x2c8) + 0xc),
                     *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x10));
  if ((uVar1 == 0) ||
     (uVar1 = math::maximum<unsigned_int>
                        (*(uint *)(*(long *)(in_RDI + 0x2c8) + 0xc),
                         *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x10)), 0x1000 < uVar1)) {
    local_1 = false;
  }
  else {
    uVar1 = task_pool::init((task_pool *)(in_RDI + 8),
                            (EVP_PKEY_CTX *)(ulong)*(uint *)(in_RSI + 0x358));
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      local_1 = compress_internal(in_stack_00000108);
      task_pool::deinit((task_pool *)CONCAT17(uVar4,CONCAT16(uVar3,in_stack_ffffffffffffffc0)));
      if ((local_1) && (in_RDX != (float *)0x0)) {
        local_28 = 0;
        for (uVar1 = 0; uVar1 < *(uint *)(*(long *)(in_RDI + 0x2c8) + 8); uVar1 = uVar1 + 1) {
          for (uVar5 = 0; uVar5 < *(uint *)(*(long *)(in_RDI + 0x2c8) + 0x14); uVar5 = uVar5 + 1) {
            uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_total_pixels
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                               (in_RDI + 0x2d0 + (ulong)uVar1 * 0x300 + (ulong)uVar5 * 0x30));
            local_28 = uVar2 + local_28;
          }
        }
        uVar2 = vector<unsigned_char>::size((vector<unsigned_char> *)(in_RDI + 0x15a0));
        *in_RDX = ((float)uVar2 * 8.0) / (float)local_28;
      }
    }
  }
  return local_1;
}

Assistant:

bool crn_comp::compress_pass(const crn_comp_params& params, float* pEffective_bitrate) {
  clear();

  if (pEffective_bitrate)
    *pEffective_bitrate = 0.0f;

  m_pParams = &params;
  m_has_etc_color_blocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A || params.m_format == cCRNFmtETC1S || params.m_format == cCRNFmtETC2AS;
  m_has_subblocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A;

  if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
    return false;

  if (!m_task_pool.init(params.m_num_helper_threads))
    return false;

  bool status = compress_internal();

  m_task_pool.deinit();

  if ((status) && (pEffective_bitrate)) {
    uint total_pixels = 0;

    for (uint f = 0; f < m_pParams->m_faces; f++)
      for (uint l = 0; l < m_pParams->m_levels; l++)
        total_pixels += m_images[f][l].get_total_pixels();

    *pEffective_bitrate = (m_comp_data.size() * 8.0f) / total_pixels;
  }

  return status;
}